

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

int sexp_reset_weak_references(sexp_conflict ctx)

{
  short sVar1;
  short sVar2;
  char *pcVar3;
  sexp_uint_t sVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  sexp_uint_t sVar8;
  sexp_conflict in_RDI;
  sexp_free_list_conflict r;
  sexp_free_list_conflict q;
  sexp_conflict *v;
  sexp_conflict end;
  sexp_conflict t;
  sexp_conflict p;
  sexp_heap_conflict h;
  int all_reset_p;
  int broke;
  int len;
  int i;
  sexp_conflict local_58;
  sexp_conflict local_50;
  sexp_conflict local_30;
  sexp_heap_conflict local_28;
  int local_1c;
  int local_14;
  int local_4;
  
  if ((((in_RDI->value).type.setters)->value).context.mark_stack[7].start == (sexp_conflict *)0x3e)
  {
    local_4 = 0;
  }
  else {
    local_1c = 0;
    for (local_28 = (in_RDI->value).context.heap; local_28 != (sexp_heap_conflict)0x0;
        local_28 = local_28->next) {
      local_30 = (sexp_conflict)(local_28->data + 0x20);
      local_50 = (sexp_conflict)local_28->free_list;
      pcVar3 = local_28->data;
      sVar4 = local_28->size;
      while (local_30 < (sexp_conflict)(pcVar3 + sVar4)) {
        for (local_58 = (local_50->value).type.name;
            local_58 != (sexp_conflict)0x0 && local_58 < local_30;
            local_58 = (local_58->value).type.name) {
          local_50 = local_58;
        }
        if (local_58 == local_30) {
          local_30 = (sexp_conflict)((long)&local_30->tag + *(long *)local_58);
        }
        else {
          if ((local_30->markedp != '\0') &&
             (lVar5 = *(long *)((long)&((((in_RDI->value).type.setters)->value).type.getters)->value
                               + (ulong)local_30->tag * 8 + 8), 0 < *(short *)(lVar5 + 100))) {
            bVar6 = true;
            sVar1 = *(short *)(lVar5 + 100);
            iVar7 = (int)*(undefined8 *)((long)&local_30->tag + (long)(int)*(short *)(lVar5 + 0x68))
                    * (int)*(short *)(lVar5 + 0x6a) + (int)*(short *)(lVar5 + 0x66);
            for (local_14 = 0; local_14 < iVar7; local_14 = local_14 + 1) {
              if (((*(long *)((long)&local_30->tag + (long)local_14 * 8 + (long)(int)sVar1) == 0) ||
                  ((*(ulong *)((long)&local_30->tag + (long)local_14 * 8 + (long)(int)sVar1) & 3) !=
                   0)) || (*(char *)(*(long *)((long)&local_30->tag +
                                              (long)local_14 * 8 + (long)(int)sVar1) + 4) != '\0'))
              {
                bVar6 = false;
              }
              else {
                *(undefined8 *)((long)&local_30->tag + (long)local_14 * 8 + (long)(int)sVar1) = 0x3e
                ;
                local_30->field_0x5 = local_30->field_0x5 & 0xfb | 4;
              }
            }
            if (bVar6) {
              local_1c = local_1c + 1;
              sVar2 = *(short *)(lVar5 + 0x6c);
              for (; local_14 < sVar2 + iVar7; local_14 = local_14 + 1) {
                *(undefined8 *)((long)&local_30->tag + (long)local_14 * 8 + (long)(int)sVar1) = 0x3e
                ;
              }
            }
          }
          sVar8 = sexp_allocated_bytes(in_RDI,local_30);
          local_30 = (sexp_conflict)((long)&local_30->tag + (sVar8 + 0x1f & 0xffffffffffffffe0));
        }
      }
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int sexp_reset_weak_references(sexp ctx) {
  int i, len, broke, all_reset_p;
  sexp_heap h;
  sexp p, t, end, *v;
  sexp_free_list q, r;
  if (sexp_not(sexp_global(ctx, SEXP_G_WEAK_OBJECTS_PRESENT)))
    return 0;
  broke = 0;
  /* just scan the whole heap */
  for (h = sexp_context_heap(ctx) ; h; h=h->next) {
    p = sexp_heap_first_block(h);
    q = h->free_list;
    end = sexp_heap_end(h);
    while (p < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip it */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      if (sexp_valid_object_p(ctx, p) && sexp_markedp(p)) {
        t = sexp_object_type(ctx, p);
        if (sexp_type_weak_base(t) > 0) {
          all_reset_p = 1;
          v = (sexp*) ((char*)p + sexp_type_weak_base(t));
          len = sexp_type_num_weak_slots_of_object(t, p);
          for (i=0; i<len; i++) {
            if (v[i] && sexp_pointerp(v[i]) && ! sexp_markedp(v[i])) {
              v[i] = SEXP_FALSE;
              sexp_brokenp(p) = 1;
            } else {
              all_reset_p = 0;
            }
          }
          if (all_reset_p) {      /* ephemerons */
            broke++;
            len += sexp_type_weak_len_extra(t);
            for ( ; i<len; i++) v[i] = SEXP_FALSE;
          }
        }
      }
      p = (sexp) (((char*)p)+sexp_heap_align(sexp_allocated_bytes(ctx, p)));
    }
  }
  sexp_debug_printf("%p (broke %d weak references)", ctx, broke);
  return broke;
}